

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_9,_0,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  long lVar3;
  int row;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat3 m;
  Vec4 *local_80;
  undefined8 local_78;
  float local_70 [5];
  Matrix<float,_3,_3> local_5c;
  Matrix<float,_3,_3> local_38;
  
  pfVar2 = (float *)&local_38;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar6 = 0x3f800000;
      if (lVar3 != lVar5) {
        uVar6 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar5) = uVar6;
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar4 = lVar4 + 1;
    pfVar2 = pfVar2 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar4 != 3);
  local_38.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  local_38.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
  local_38.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
  local_38.m_data.m_data[1].m_data[0] = (float)uVar1;
  local_38.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  local_38.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  local_38.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  tcu::operator*(&local_5c,&local_38,-0.2);
  local_78 = (ulong)local_78._4_4_ << 0x20;
  local_80 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_80 + lVar3 * 4) =
         local_5c.m_data.m_data[0].m_data[lVar3] + local_5c.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_70[4] = 0.0;
  local_70[2] = 0.0;
  local_70[3] = 0.0;
  lVar3 = 0;
  do {
    local_70[lVar3 + 2] =
         *(float *)((long)&local_80 + lVar3 * 4) +
         *(float *)((long)(local_38.m_data.m_data + -1) + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_80 = &evalCtx->color;
  local_78 = 0x100000000;
  local_70[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_80 + lVar3 * 4)] = local_70[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}